

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

void wabt::anon_unknown_1::ResolveImplicitlyDefinedFunctionType
               (Location *loc,Module *module,FuncDeclaration *decl)

{
  long *plVar1;
  size_type sVar2;
  size_t sVar3;
  long lVar4;
  long *plVar5;
  Index IVar6;
  tuple<wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_> tVar7;
  unique_ptr<wabt::FuncType,_std::default_delete<wabt::FuncType>_> func_type;
  __uniq_ptr_impl<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_> local_40;
  long *local_38;
  
  if (decl->has_func_type == false) {
    IVar6 = Module::GetFuncTypeIndex(module,&decl->sig);
    if (IVar6 == 0xffffffff) {
      tVar7.
      super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>.
      super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl =
           (_Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>)
           operator_new(0x48);
      *(long *)((long)tVar7.
                      super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
                      .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl + 8) = 0;
      *(long *)((long)tVar7.
                      super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
                      .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl + 0x10) =
           0;
      *(undefined ***)
       tVar7.
       super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>.
       super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl =
           &PTR__ModuleField_001c04b0;
      sVar2 = (loc->filename).size_;
      sVar3 = (loc->field_1).field_1.offset;
      lVar4 = *(long *)((long)&loc->field_1 + 8);
      *(char **)((long)tVar7.
                       super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
                       .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl + 0x18) =
           (loc->filename).data_;
      *(size_type *)
       ((long)tVar7.
              super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
              .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl + 0x20) = sVar2;
      *(size_t *)
       ((long)tVar7.
              super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
              .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl + 0x28) = sVar3;
      *(long *)((long)tVar7.
                      super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
                      .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl + 0x30) =
           lVar4;
      *(undefined4 *)
       ((long)tVar7.
              super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
              .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl + 0x38) = 4;
      *(undefined ***)
       tVar7.
       super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>.
       super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl =
           &PTR__TypeModuleField_001c0428;
      *(long *)((long)tVar7.
                      super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
                      .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl + 0x40) =
           0;
      MakeUnique<wabt::FuncType>();
      plVar1 = local_38;
      std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator=
                ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)((long)local_38 + 0x50),
                 &(decl->sig).param_types);
      std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator=
                ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)((long)plVar1 + 0x68),
                 &(decl->sig).result_types);
      plVar5 = local_38;
      local_38 = (long *)0x0;
      plVar1 = *(long **)((long)tVar7.
                                super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
                                .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl
                         + 0x40);
      *(long **)((long)tVar7.
                       super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
                       .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl + 0x40) =
           plVar5;
      if (plVar1 != (long *)0x0) {
        (**(code **)(*plVar1 + 8))();
      }
      local_40._M_t.
      super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>.
      super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl =
           (tuple<wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>)
           (tuple<wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>)
           tVar7.
           super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
           .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl;
      Module::AppendField(module,(unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_>
                                  *)&local_40);
      if ((_Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>)
          local_40._M_t.
          super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
          .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl !=
          (TypeModuleField *)0x0) {
        (**(code **)(*(long *)local_40._M_t.
                              super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>
                              .super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl +
                    8))();
      }
      local_40._M_t.
      super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>.
      super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl =
           (tuple<wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>)
           (_Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>)
           0x0;
      if (local_38 != (long *)0x0) {
        (**(code **)(*local_38 + 8))();
      }
    }
  }
  return;
}

Assistant:

void ResolveImplicitlyDefinedFunctionType(const Location& loc,
                                          Module* module,
                                          const FuncDeclaration& decl) {
  // Resolve implicitly defined function types, e.g.: (func (param i32) ...)
  if (!decl.has_func_type) {
    Index func_type_index = module->GetFuncTypeIndex(decl.sig);
    if (func_type_index == kInvalidIndex) {
      auto func_type_field = MakeUnique<TypeModuleField>(loc);
      auto func_type = MakeUnique<FuncType>();
      func_type->sig = decl.sig;
      func_type_field->type = std::move(func_type);
      module->AppendField(std::move(func_type_field));
    }
  }
}